

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O0

void __thiscall TestServerConnector::SendRawRequest(TestServerConnector *this,string *request)

{
  string local_38 [32];
  string *local_18;
  string *request_local;
  TestServerConnector *this_local;
  
  local_18 = request;
  request_local = (string *)this;
  (*this->handler->_vptr_JsonRpcServer[2])(local_38,this->handler,request);
  std::__cxx11::string::operator=((string *)&this->raw_response,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SendRawRequest(const string &request) { this->raw_response = handler.HandleRequest(request); }